

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionOperator.cpp
# Opt level: O0

void __thiscall
adios2::plugin::EncryptionOperator::EncryptImpl::GenerateOrReadKey(EncryptImpl *this)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  char *pcVar5;
  runtime_error *prVar6;
  long in_RDI;
  fstream keyFile;
  long local_218 [2];
  char local_208 [520];
  
  pcVar5 = (char *)std::__cxx11::string::c_str();
  _Var3 = std::operator|(_S_in,_S_out);
  std::fstream::fstream(local_218,pcVar5,_Var3);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if (bVar1) {
    std::istream::read((char *)local_218,in_RDI + 0x20);
    std::fstream::close();
  }
  else {
    _Var3 = std::__cxx11::string::c_str();
    std::fstream::open((char *)local_218,_Var3);
    bVar2 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
    if ((bVar2 & 1) != 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"couldn\'t open file to write key");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    crypto_secretbox_keygen(in_RDI + 0x20);
    std::ostream::write(local_208,in_RDI + 0x20);
    std::fstream::close();
  }
  iVar4 = sodium_mlock(in_RDI + 0x20,0x20);
  if (iVar4 == -1) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar6,
               "Unable to lock memory location of secret key, due to system limit on amount of memory that can be locked by a process."
              );
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined1 *)(in_RDI + 0x40) = 1;
  std::fstream::~fstream(local_218);
  return;
}

Assistant:

void GenerateOrReadKey()
    {
        // if the key file already exists, we'll use that key,
        // otherwise we'll generate one and write it out
        std::fstream keyFile(KeyFilename.c_str());
        if (keyFile)
        {
            keyFile.read(reinterpret_cast<char *>(&Key), crypto_secretbox_KEYBYTES);
            keyFile.close();
        }
        else
        {
            keyFile.open(KeyFilename.c_str(), std::fstream::out);
            if (!keyFile)
            {
                throw std::runtime_error("couldn't open file to write key");
            }
            crypto_secretbox_keygen(Key);
            keyFile.write(reinterpret_cast<char *>(&Key), crypto_secretbox_KEYBYTES);
            keyFile.close();
        }

        // lock the key to avoid swapping to disk
        if (sodium_mlock(Key, crypto_secretbox_KEYBYTES) == -1)
        {
            throw std::runtime_error("Unable to lock memory location of secret key,"
                                     " due to system limit on amount of memory that can be locked "
                                     "by a process.");
        }
        KeyValid = true;
    }